

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

int64_t msa_pcnt_df(uint32_t df,int64_t arg)

{
  byte bVar1;
  ulong uVar2;
  
  bVar1 = (byte)(-1L << ((char)df + 3U & 0x3f));
  uVar2 = (ulong)(arg << (bVar1 & 0x3f)) >> (bVar1 & 0x3f);
  uVar2 = (uVar2 >> 1 & 0x5555555555555555) + (uVar2 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = (uVar2 >> 4 & 0x707070707070707) + (uVar2 & 0x707070707070707);
  uVar2 = (uVar2 >> 8 & 0xf000f000f000f) + (uVar2 & 0xf000f000f000f);
  uVar2 = (uVar2 >> 0x10 & 0x1f0000001f) + (uVar2 & 0x1f0000001f);
  return (uVar2 >> 0x20) + (uVar2 & 0xffffffff);
}

Assistant:

static inline int64_t msa_pcnt_df(uint32_t df, int64_t arg)
{
    uint64_t x;

    x = UNSIGNED(arg, df);

    x = (x & 0x5555555555555555ULL) + ((x >>  1) & 0x5555555555555555ULL);
    x = (x & 0x3333333333333333ULL) + ((x >>  2) & 0x3333333333333333ULL);
    x = (x & 0x0F0F0F0F0F0F0F0FULL) + ((x >>  4) & 0x0F0F0F0F0F0F0F0FULL);
    x = (x & 0x00FF00FF00FF00FFULL) + ((x >>  8) & 0x00FF00FF00FF00FFULL);
    x = (x & 0x0000FFFF0000FFFFULL) + ((x >> 16) & 0x0000FFFF0000FFFFULL);
    x = (x & 0x00000000FFFFFFFFULL) + ((x >> 32));

    return x;
}